

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void RunLengthCodeZeros(size_t in_size,uint32_t *v,size_t *out_size,uint32_t *max_run_length_prefix)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint32_t extra_bits_1;
  uint32_t extra_bits;
  uint32_t run_length_prefix;
  size_t k;
  uint local_60;
  uint32_t reps_1;
  uint32_t reps;
  uint32_t max_prefix;
  size_t i;
  uint32_t max_reps;
  uint32_t *max_run_length_prefix_local;
  size_t *out_size_local;
  uint32_t *v_local;
  size_t in_size_local;
  
  i._4_4_ = 0;
  _reps = 0;
  while (_reps < in_size) {
    local_60 = 0;
    while( true ) {
      bVar3 = false;
      if (_reps < in_size) {
        bVar3 = v[_reps] != 0;
      }
      if (!bVar3) break;
      _reps = _reps + 1;
    }
    while( true ) {
      bVar3 = false;
      if (_reps < in_size) {
        bVar3 = v[_reps] == 0;
      }
      if (!bVar3) break;
      local_60 = local_60 + 1;
      _reps = _reps + 1;
    }
    if (i._4_4_ < local_60) {
      local_84 = local_60;
    }
    else {
      local_84 = i._4_4_;
    }
    i._4_4_ = local_84;
  }
  if (i._4_4_ == 0) {
    local_88 = 0;
  }
  else {
    local_88 = 0x1f;
    if (i._4_4_ != 0) {
      for (; i._4_4_ >> local_88 == 0; local_88 = local_88 - 1) {
      }
    }
  }
  local_8c = *max_run_length_prefix;
  if (local_88 < local_8c) {
    local_8c = local_88;
  }
  *max_run_length_prefix = local_8c;
  *out_size = 0;
  _reps = 0;
LAB_001424f5:
  do {
    while( true ) {
      if (in_size <= _reps) {
        return;
      }
      if (_reps < *out_size) {
        __assert_fail("*out_size <= i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/brotli_bit_stream.c"
                      ,0x296,
                      "void RunLengthCodeZeros(const size_t, uint32_t *restrict, size_t *restrict, uint32_t *restrict)"
                     );
      }
      if (v[_reps] == 0) break;
      v[*out_size] = v[_reps] + *max_run_length_prefix;
      _reps = _reps + 1;
      *out_size = *out_size + 1;
    }
    k._4_4_ = 1;
    _extra_bits = _reps;
    while( true ) {
      _extra_bits = _extra_bits + 1;
      bVar3 = false;
      if (_extra_bits < in_size) {
        bVar3 = v[_extra_bits] == 0;
      }
      if (!bVar3) break;
      k._4_4_ = k._4_4_ + 1;
    }
    _reps = k._4_4_ + _reps;
    while( true ) {
      if (k._4_4_ == 0) goto LAB_001424f5;
      bVar2 = (byte)local_8c;
      if (k._4_4_ < (uint)(2 << (bVar2 & 0x1f))) break;
      v[*out_size] = local_8c + ((1 << (bVar2 & 0x1f)) + -1) * 0x200;
      k._4_4_ = k._4_4_ - ((2 << (bVar2 & 0x1f)) + -1);
      *out_size = *out_size + 1;
    }
    iVar1 = 0x1f;
    if (k._4_4_ != 0) {
      for (; k._4_4_ >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    v[*out_size] = iVar1 + (k._4_4_ - (1 << ((byte)iVar1 & 0x1f))) * 0x200;
    *out_size = *out_size + 1;
  } while( true );
}

Assistant:

static void RunLengthCodeZeros(const size_t in_size,
    uint32_t* BROTLI_RESTRICT v, size_t* BROTLI_RESTRICT out_size,
    uint32_t* BROTLI_RESTRICT max_run_length_prefix) {
  uint32_t max_reps = 0;
  size_t i;
  uint32_t max_prefix;
  for (i = 0; i < in_size;) {
    uint32_t reps = 0;
    for (; i < in_size && v[i] != 0; ++i) ;
    for (; i < in_size && v[i] == 0; ++i) {
      ++reps;
    }
    max_reps = BROTLI_MAX(uint32_t, reps, max_reps);
  }
  max_prefix = max_reps > 0 ? Log2FloorNonZero(max_reps) : 0;
  max_prefix = BROTLI_MIN(uint32_t, max_prefix, *max_run_length_prefix);
  *max_run_length_prefix = max_prefix;
  *out_size = 0;
  for (i = 0; i < in_size;) {
    assert(*out_size <= i);
    if (v[i] != 0) {
      v[*out_size] = v[i] + *max_run_length_prefix;
      ++i;
      ++(*out_size);
    } else {
      uint32_t reps = 1;
      size_t k;
      for (k = i + 1; k < in_size && v[k] == 0; ++k) {
        ++reps;
      }
      i += reps;
      while (reps != 0) {
        if (reps < (2u << max_prefix)) {
          uint32_t run_length_prefix = Log2FloorNonZero(reps);
          const uint32_t extra_bits = reps - (1u << run_length_prefix);
          v[*out_size] = run_length_prefix + (extra_bits << 9);
          ++(*out_size);
          break;
        } else {
          const uint32_t extra_bits = (1u << max_prefix) - 1u;
          v[*out_size] = max_prefix + (extra_bits << 9);
          reps -= (2u << max_prefix) - 1u;
          ++(*out_size);
        }
      }
    }
  }
}